

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O1

int cuddSwapping(DdManager *table,int lower,int upper,Cudd_ReorderingType heuristic)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint *puVar6;
  ulong uVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  int iVar12;
  uint uVar13;
  DdHalfWord DVar14;
  uint uVar15;
  uint uVar16;
  DdHalfWord x;
  DdHalfWord y;
  DdHalfWord DVar17;
  bool bVar18;
  DdHalfWord local_9c;
  int local_7c;
  
  iVar12 = upper - lower;
  if (iVar12 < 0) {
    return 1;
  }
  uVar15 = 0xffffffff;
  iVar1 = 0;
LAB_00801a9c:
  if (table->siftMaxSwap <= ddTotalNumberSwapping) {
    return 1;
  }
  if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
    if (lower <= upper) {
      puVar6 = &table->subtables[lower].keys;
      uVar13 = 0xffffffff;
      uVar16 = lower;
      do {
        if ((int)uVar13 < (int)*puVar6) {
          uVar15 = uVar16;
          uVar13 = *puVar6;
        }
        puVar6 = puVar6 + 0xe;
        uVar16 = uVar16 + 1;
      } while (upper + 1U != uVar16);
    }
    uVar16 = uVar15;
    if (upper - uVar15 != 0) {
      uVar7 = Cudd_Random();
      uVar16 = uVar15 + (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff)
                             % (long)(int)(upper - uVar15)) + 1;
    }
    if ((int)(uVar15 + ~lower) < 1) {
      uVar7 = (ulong)(uint)lower;
    }
    else {
      do {
        uVar7 = Cudd_Random();
        uVar7 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) %
                (long)(int)(uVar15 + ~lower);
      } while ((uint)uVar7 == uVar16);
      uVar7 = uVar7 & 0xffffffff;
    }
  }
  else {
    uVar7 = Cudd_Random();
    do {
      uVar5 = Cudd_Random();
      iVar4 = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) %
                   (long)(iVar12 + 1));
      iVar2 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                   (long)(iVar12 + 1));
    } while (iVar4 == iVar2);
    uVar7 = (ulong)(uint)(iVar4 + lower);
    uVar16 = iVar2 + lower;
  }
  DVar14 = (DdHalfWord)uVar7;
  uVar13 = uVar16;
  if ((int)uVar16 < (int)DVar14) {
    uVar13 = DVar14;
  }
  uVar5 = (ulong)uVar16;
  if ((int)DVar14 < (int)uVar16) {
    uVar5 = uVar7;
  }
  DVar14 = uVar13 - 1;
  iVar2 = table->keys - table->isolated;
  pDVar10 = (DdNode *)0x0;
  iVar4 = (int)uVar5;
  local_9c = uVar13;
  local_7c = iVar2;
  do {
    x = (DdHalfWord)uVar5;
    y = x + 1;
    pDVar11 = pDVar10;
    if (y == DVar14) {
      iVar3 = cuddSwapInPlace(table,x,y);
      if ((iVar3 == 0) || (pDVar8 = cuddDynamicAllocNode(table), pDVar8 == (DdNode *)0x0))
      goto LAB_00801dfb;
      pDVar8->index = x;
      pDVar8->ref = y;
      *(int *)((long)&pDVar8->next + 4) = iVar3;
      (pDVar8->type).kids.T = pDVar10;
      iVar3 = cuddSwapInPlace(table,DVar14,local_9c);
      pDVar11 = pDVar8;
      if ((iVar3 == 0) || (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0))
      goto LAB_00801dfb;
      pDVar9->index = DVar14;
      pDVar9->ref = local_9c;
      *(int *)((long)&pDVar9->next + 4) = iVar3;
      (pDVar9->type).kids.T = pDVar8;
      iVar3 = cuddSwapInPlace(table,x,y);
      pDVar11 = pDVar9;
      if (iVar3 == 0) goto LAB_00801dfb;
LAB_00801c75:
      pDVar10 = cuddDynamicAllocNode(table);
      pDVar11 = pDVar9;
      if (pDVar10 == (DdNode *)0x0) goto LAB_00801dfb;
      pDVar10->index = x;
      DVar17 = local_9c;
      local_9c = y;
    }
    else {
      iVar3 = cuddSwapInPlace(table,x,y);
      if (x == DVar14) {
        pDVar9 = pDVar10;
        if (iVar3 != 0) goto LAB_00801c75;
        goto LAB_00801dfb;
      }
      if ((iVar3 == 0) || (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0))
      goto LAB_00801dfb;
      pDVar9->index = x;
      pDVar9->ref = y;
      *(int *)((long)&pDVar9->next + 4) = iVar3;
      (pDVar9->type).kids.T = pDVar10;
      iVar3 = cuddSwapInPlace(table,DVar14,local_9c);
      pDVar11 = pDVar9;
      if ((iVar3 == 0) || (pDVar10 = cuddDynamicAllocNode(table), pDVar10 == (DdNode *)0x0))
      goto LAB_00801dfb;
      pDVar10->index = DVar14;
      DVar17 = y;
      x = DVar14;
    }
    pDVar10->ref = local_9c;
    *(int *)((long)&pDVar10->next + 4) = iVar3;
    (pDVar10->type).kids.T = pDVar9;
    DVar14 = x - 1;
    if (((int)uVar13 <= (int)DVar17) || ((double)local_7c * table->maxGrowth < (double)iVar3))
    break;
    if (iVar3 < local_7c) {
      local_7c = iVar3;
    }
    uVar5 = (ulong)DVar17;
    local_9c = x;
  } while( true );
  if (iVar4 < (int)x) {
    iVar4 = cuddSwapInPlace(table,DVar14,x);
    pDVar11 = pDVar10;
    if ((iVar4 == 0) || (pDVar8 = cuddDynamicAllocNode(table), pDVar8 == (DdNode *)0x0)) {
LAB_00801dfb:
      if (pDVar11 != (DdNode *)0x0) {
        pDVar10 = table->nextFree;
        do {
          pDVar8 = pDVar11;
          pDVar11 = (pDVar8->type).kids.T;
          pDVar8->ref = 0;
          pDVar8->next = pDVar10;
          pDVar10 = pDVar8;
        } while (pDVar11 != (DdNode *)0x0);
        table->nextFree = pDVar8;
      }
      pDVar10 = (DdNode *)0x0;
    }
    else {
      pDVar8->index = DVar14;
      pDVar8->ref = x;
      *(int *)((long)&pDVar8->next + 4) = iVar4;
      (pDVar8->type).kids.T = pDVar10;
      pDVar10 = pDVar8;
    }
  }
  if (pDVar10 == (DdNode *)0x0) {
    return 0;
  }
  iVar2 = ddSiftingBackward(table,iVar2,(Move *)pDVar10);
  if (iVar2 == 0) {
    pDVar11 = table->nextFree;
    do {
      pDVar8 = pDVar10;
      pDVar10 = (pDVar8->type).kids.T;
      pDVar8->ref = 0;
      pDVar8->next = pDVar11;
      pDVar11 = pDVar8;
    } while (pDVar10 != (DdNode *)0x0);
    table->nextFree = pDVar8;
    return 0;
  }
  pDVar11 = table->nextFree;
  do {
    pDVar8 = pDVar10;
    pDVar10 = (pDVar8->type).kids.T;
    pDVar8->ref = 0;
    pDVar8->next = pDVar11;
    pDVar11 = pDVar8;
  } while (pDVar10 != (DdNode *)0x0);
  table->nextFree = pDVar8;
  bVar18 = iVar1 == iVar12;
  iVar1 = iVar1 + 1;
  if (bVar18) {
    return 1;
  }
  goto LAB_00801a9c;
}

Assistant:

int
cuddSwapping(
  DdManager * table,
  int lower,
  int upper,
  Cudd_ReorderingType heuristic)
{
    int i, j;
    int max, keys;
    int nvars;
    int x, y;
    int iterate;
    int previousSize;
    Move *moves, *move;
    int pivot = -1;
    int modulo;
    int result;

#ifdef DD_DEBUG
    /* Sanity check */
    assert(lower >= 0 && upper < table->size && lower <= upper);
#endif

    nvars = upper - lower + 1;
    iterate = nvars;

    for (i = 0; i < iterate; i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
            max = -1;
            for (j = lower; j <= upper; j++) {
                if ((keys = table->subtables[j].keys) > max) {
                    max = keys;
                    pivot = j;
                }
            }

            modulo = upper - pivot;
            if (modulo == 0) {
                y = pivot;
            } else{
                y = pivot + 1 + ((int) Cudd_Random() % modulo);
            }

            modulo = pivot - lower - 1;
            if (modulo < 1) {
                x = lower;
            } else{
                do {
                    x = (int) Cudd_Random() % modulo;
                } while (x == y);
            }
        } else {
            x = ((int) Cudd_Random() % nvars) + lower;
            do {
                y = ((int) Cudd_Random() % nvars) + lower;
            } while (x == y);
        }
        previousSize = table->keys - table->isolated;
        moves = ddSwapAny(table,x,y);
        if (moves == NULL) goto cuddSwappingOutOfMem;
        result = ddSiftingBackward(table,previousSize,moves);
        if (!result) goto cuddSwappingOutOfMem;
        while (moves != NULL) {
            move = moves->next;
            cuddDeallocMove(table, moves);
            moves = move;
        }
#ifdef DD_STATS
        if (table->keys < (unsigned) previousSize + table->isolated) {
            (void) fprintf(table->out,"-");
        } else if (table->keys > (unsigned) previousSize + table->isolated) {
            (void) fprintf(table->out,"+");     /* should never happen */
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
#if 0
        (void) fprintf(table->out,"#:t_SWAPPING %8d: tmp size\n",
                       table->keys - table->isolated);
#endif
    }

    return(1);

cuddSwappingOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }

    return(0);

}